

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O0

void __thiscall
priorityQueueTest_crossing_data_Test::priorityQueueTest_crossing_data_Test
          (priorityQueueTest_crossing_data_Test *this)

{
  priorityQueueTest_crossing_data_Test *this_local;
  
  priorityQueueTest::priorityQueueTest(&this->super_priorityQueueTest);
  (this->super_priorityQueueTest).super_Test._vptr_Test =
       (_func_int **)&PTR__priorityQueueTest_crossing_data_Test_001adef8;
  return;
}

Assistant:

TEST_F(priorityQueueTest, crossing_data) {
    std::priority_queue<double> std_pq;
    Priority_queue pq;
    for (int i = 0; i != 100000; ++i) {
        std_pq.push((double) i);
        pq.push((double) i);
        std_pq.push((double) -i);
        pq.push((double) -i);
        ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
        ASSERT_EQ(std_pq.size(), pq.size());
    }
    ASSERT_EQ(std_pq.size(), pq.size());
    while (!pq.empty()) {
        ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
        std_pq.pop();
        pq.pop();
    }
    ASSERT_EQ(pq.size(), 0);
    ASSERT_EQ(std_pq.size(), 0);
}